

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectRestraint.cpp
# Opt level: O1

void __thiscall
OpenMD::ObjectRestraint::calcForce(ObjectRestraint *this,Vector3d *struc,RotMat3x3d *A)

{
  uint i;
  long lVar1;
  mapped_type *pmVar2;
  double *pdVar3;
  uint i_5;
  RotMat3x3d *pRVar4;
  double (*padVar5) [3];
  double *pdVar6;
  long lVar7;
  uint j_1;
  double *pdVar8;
  uint k;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  SquareMatrix3<double> result;
  RealType swingY;
  RealType swingX;
  RealType twistAngle;
  Vector<double,_3U> result_6;
  RotMat3x3d temp;
  Quat4d quat;
  double local_148 [4];
  double local_128 [10];
  double local_d8;
  double local_d0 [5];
  SquareMatrix3<double> local_a8;
  Vector3d local_58;
  Quaternion<double> local_38;
  
  local_58.super_Vector<double,_3U>.data_[2] = (struc->super_Vector<double,_3U>).data_[2];
  local_58.super_Vector<double,_3U>.data_[0] = (struc->super_Vector<double,_3U>).data_[0];
  local_58.super_Vector<double,_3U>.data_[1] = (struc->super_Vector<double,_3U>).data_[1];
  calcForce(this,&local_58);
  if (3 < (this->super_Restraint).restType_) {
    local_148[0] = 0.0;
    local_148[1] = 0.0;
    lVar1 = 0;
    local_148[2] = 0.0;
    pRVar4 = &this->refA_;
    pdVar3 = local_128;
    local_128[8] = 0.0;
    local_128[6] = 0.0;
    local_128[7] = 0.0;
    local_128[4] = 0.0;
    local_128[5] = 0.0;
    local_128[2] = 0.0;
    local_128[3] = 0.0;
    local_128[0] = 0.0;
    local_128[1] = 0.0;
    do {
      lVar7 = 0;
      pdVar6 = pdVar3;
      do {
        *pdVar6 = (pRVar4->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                  [lVar7];
        lVar7 = lVar7 + 1;
        pdVar6 = pdVar6 + 3;
      } while (lVar7 != 3);
      lVar1 = lVar1 + 1;
      pdVar3 = pdVar3 + 1;
      pRVar4 = (RotMat3x3d *)
               ((pRVar4->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
    } while (lVar1 != 3);
    local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
    local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
    local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
    local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
    local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
    local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
    local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
    local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
    lVar1 = 0;
    padVar5 = (double (*) [3])A;
    do {
      lVar7 = 0;
      pdVar3 = local_128;
      do {
        pdVar6 = local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                 [lVar1] + lVar7;
        dVar10 = *pdVar6;
        lVar9 = 0;
        pdVar8 = pdVar3;
        do {
          dVar10 = dVar10 + (((SquareMatrix<double,_3> *)*padVar5)->super_RectMatrix<double,_3U,_3U>
                            ).data_[0][lVar9] * *pdVar8;
          lVar9 = lVar9 + 1;
          pdVar8 = pdVar8 + 3;
        } while (lVar9 != 3);
        *pdVar6 = dVar10;
        lVar7 = lVar7 + 1;
        pdVar3 = pdVar3 + 1;
      } while (lVar7 != 3);
      lVar1 = lVar1 + 1;
      padVar5 = padVar5 + 1;
    } while (lVar1 != 3);
    SquareMatrix3<double>::toQuaternion(&local_38,&local_a8);
    Quaternion<double>::toTwistSwing(&local_38,local_d0,&local_d8,local_128 + 9);
    if (((this->super_Restraint).restType_ & 4) != 0) {
      dVar11 = local_d0[0] - (this->super_Restraint).twist0_;
      dVar10 = (this->super_Restraint).kTwist_;
      dVar12 = dVar10 * 0.5 * dVar11 * dVar11;
      (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + dVar12;
      local_128[0] = 0.0;
      local_128[1] = 0.0;
      local_128[2] = 0.0;
      lVar1 = 0;
      do {
        *(double *)((long)local_128 + lVar1) =
             *(double *)((long)&OpenMD::V3Z + lVar1) * dVar10 * dVar11;
        lVar1 = lVar1 + 8;
      } while (lVar1 != 0x18);
      lVar1 = 0;
      do {
        local_148[lVar1] = local_148[lVar1] - local_128[lVar1];
        lVar1 = lVar1 + 1;
      } while (lVar1 != 3);
      if ((this->super_Restraint).printRest_ == true) {
        local_128[0] = (double)CONCAT44(local_128[0]._4_4_,4);
        pmVar2 = std::
                 map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                 ::operator[](&(this->super_Restraint).restInfo_,(key_type *)local_128);
        pmVar2->first = local_d0[0];
        pmVar2->second = dVar12;
      }
    }
    if (((this->super_Restraint).restType_ & 8) != 0) {
      dVar11 = local_d8 - (this->super_Restraint).swingX0_;
      dVar10 = (this->super_Restraint).kSwingX_;
      dVar12 = dVar10 * 0.5 * dVar11 * dVar11;
      (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + dVar12;
      local_128[0] = 0.0;
      local_128[1] = 0.0;
      local_128[2] = 0.0;
      lVar1 = 0;
      do {
        *(double *)((long)local_128 + lVar1) =
             *(double *)((long)&OpenMD::V3X + lVar1) * dVar10 * dVar11;
        lVar1 = lVar1 + 8;
      } while (lVar1 != 0x18);
      lVar1 = 0;
      do {
        local_148[lVar1] = local_148[lVar1] - local_128[lVar1];
        lVar1 = lVar1 + 1;
      } while (lVar1 != 3);
      if ((this->super_Restraint).printRest_ == true) {
        local_128[0] = (double)CONCAT44(local_128[0]._4_4_,8);
        pmVar2 = std::
                 map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                 ::operator[](&(this->super_Restraint).restInfo_,(key_type *)local_128);
        pmVar2->first = local_d8;
        pmVar2->second = dVar12;
      }
    }
    if (((this->super_Restraint).restType_ & 0x10) != 0) {
      dVar11 = local_128[9] - (this->super_Restraint).swingY0_;
      dVar10 = (this->super_Restraint).kSwingY_;
      dVar12 = (this->super_Restraint).kSwingX_ * 0.5 * dVar11 * dVar11;
      (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + dVar12;
      local_128[0] = 0.0;
      local_128[1] = 0.0;
      local_128[2] = 0.0;
      lVar1 = 0;
      do {
        *(double *)((long)local_128 + lVar1) =
             *(double *)((long)&OpenMD::V3Y + lVar1) * dVar10 * dVar11;
        lVar1 = lVar1 + 8;
      } while (lVar1 != 0x18);
      lVar1 = 0;
      do {
        local_148[lVar1] = local_148[lVar1] - local_128[lVar1];
        lVar1 = lVar1 + 1;
      } while (lVar1 != 3);
      if ((this->super_Restraint).printRest_ == true) {
        local_128[0] = (double)CONCAT44(local_128[0]._4_4_,0x10);
        pmVar2 = std::
                 map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                 ::operator[](&(this->super_Restraint).restInfo_,(key_type *)local_128);
        pmVar2->first = local_128[9];
        pmVar2->second = dVar12;
      }
    }
    pdVar3 = local_128;
    local_128[6] = 0.0;
    local_128[7] = 0.0;
    local_128[4] = 0.0;
    local_128[5] = 0.0;
    local_128[2] = 0.0;
    local_128[3] = 0.0;
    local_128[0] = 0.0;
    local_128[1] = 0.0;
    local_128[8] = 0.0;
    lVar1 = 0;
    do {
      lVar7 = 0;
      pdVar6 = pdVar3;
      do {
        *pdVar6 = (((SquareMatrix<double,_3> *)*(double (*) [3])A)->super_RectMatrix<double,_3U,_3U>
                  ).data_[0][lVar7];
        lVar7 = lVar7 + 1;
        pdVar6 = pdVar6 + 3;
      } while (lVar7 != 3);
      lVar1 = lVar1 + 1;
      pdVar3 = pdVar3 + 1;
      A = (RotMat3x3d *)((long)A + 0x18);
    } while (lVar1 != 3);
    local_d0[1] = 0.0;
    local_d0[2] = 0.0;
    local_d0[3] = 0.0;
    pdVar3 = local_128;
    lVar1 = 0;
    do {
      dVar10 = local_d0[lVar1 + 1];
      lVar7 = 0;
      do {
        dVar10 = dVar10 + pdVar3[lVar7] * local_148[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      local_d0[lVar1 + 1] = dVar10;
      lVar1 = lVar1 + 1;
      pdVar3 = pdVar3 + 3;
    } while (lVar1 != 3);
    dVar10 = (this->super_Restraint).scaleFactor_;
    local_128[0] = 0.0;
    local_128[1] = 0.0;
    local_128[2] = 0.0;
    lVar1 = 0;
    do {
      local_128[lVar1] = local_d0[lVar1 + 1] * dVar10;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    (this->torque_).super_Vector<double,_3U>.data_[2] = local_128[2];
    (this->torque_).super_Vector<double,_3U>.data_[0] = local_128[0];
    (this->torque_).super_Vector<double,_3U>.data_[1] = local_128[1];
  }
  return;
}

Assistant:

void ObjectRestraint::calcForce(Vector3d struc, RotMat3x3d A) {
    calcForce(struc);

    // rtDisplacement is 1, rtAbsolute is 2, so anything higher than 3
    // that requires orientations:
    if (restType_ > 3) {
      Vector3d tBody(0.0);

      RotMat3x3d temp = A * refA_.transpose();
      Quat4d quat     = temp.toQuaternion();

      RealType twistAngle;
      RealType swingX, swingY;

      quat.toTwistSwing(twistAngle, swingX, swingY);

      RealType p;
      Vector3d tTwist, tSwing;

      if (restType_ & rtTwist) {
        RealType dTwist = twistAngle - twist0_;
        /// RealType dVdtwist = kTwist_ * sin(dTwist);
        /// p = kTwist_ * (1.0 - cos(dTwist) );
        RealType dVdtwist = kTwist_ * dTwist;
        p                 = 0.5 * kTwist_ * dTwist * dTwist;
        pot_ += p;
        tBody -= dVdtwist * V3Z;

        if (printRest_) restInfo_[rtTwist] = std::make_pair(twistAngle, p);
      }

      if (restType_ & rtSwingX) {
        RealType dSwingX = swingX - swingX0_;
        /// RealType dVdswingX = kSwingX_ * 0.5 * sin(2.0 * dSwingX);
        /// p = 0.25 * kSwingX_ * (1.0 - cos(2.0 * dSwingX));
        RealType dVdswingX = kSwingX_ * dSwingX;
        p                  = 0.5 * kSwingX_ * dSwingX * dSwingX;
        pot_ += p;
        tBody -= dVdswingX * V3X;
        if (printRest_) restInfo_[rtSwingX] = std::make_pair(swingX, p);
      }

      if (restType_ & rtSwingY) {
        RealType dSwingY = swingY - swingY0_;
        /// RealType dVdswingY = kSwingY_ * 0.5 * sin(2.0 * dSwingY);
        /// p = 0.25 * kSwingY_ * (1.0 - cos(2.0 * dSwingY));
        RealType dVdswingY = kSwingY_ * dSwingY;
        p                  = 0.5 * kSwingX_ * dSwingY * dSwingY;
        pot_ += p;
        tBody -= dVdswingY * V3Y;
        if (printRest_) restInfo_[rtSwingY] = std::make_pair(swingY, p);
      }

      Vector3d tLab = A.transpose() * tBody;
      torque_       = tLab * scaleFactor_;
    }
  }